

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmize.c
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  short *psVar2;
  anon_union_8_2_8127e1e2_for_xm_sample_s_11 *paVar3;
  xm_sample_t *pxVar4;
  int8_t *piVar5;
  int iVar6;
  FILE *pFVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  xm_instrument_t *pxVar12;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  size_t total_saved_bytes;
  char **ppcVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  xm_context_t *ctx;
  char **local_58;
  FILE *local_50;
  char *local_48;
  FILE *local_40;
  xm_context_t *local_38;
  
  pcVar8 = *argv;
  if (argc < 3) {
    pcVar9 = "Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n";
  }
  else {
    fprintf(_stderr,
            "%s: this format is highly non-portable. Check the README for more information.\n",
            pcVar8);
    pFVar7 = fopen(argv[(ulong)(uint)argc - 2],"rb");
    if (pFVar7 == (FILE *)0x0) {
      pcVar8 = argv[(ulong)(uint)argc - 2];
      pcVar9 = "input file %s not readable (fopen)\n";
    }
    else {
      local_58 = argv;
      iVar6 = fseek(pFVar7,0,2);
      if (iVar6 == 0) {
        pcVar8 = (char *)ftell(pFVar7);
        pcVar9 = (char *)malloc((size_t)pcVar8);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "malloc failed to allocate %lu bytes\n";
        }
        else {
          rewind(pFVar7);
          sVar10 = fread(pcVar9,(size_t)pcVar8,1,pFVar7);
          if (sVar10 == 0) {
            pcVar8 = local_58[(ulong)(uint)argc - 2];
            pcVar9 = "input file %s not readable (fread)\n";
          }
          else {
            xm_create_context_safe(&ctx,pcVar9,(size_t)pcVar8,48000);
            if (ctx == (xm_context_t *)0x0) goto LAB_00102627;
            free(pcVar9);
            ppcVar15 = local_58;
            pFVar7 = fopen(local_58[(ulong)(uint)argc - 1],"wb");
            if (pFVar7 == (FILE *)0x0) {
              pcVar8 = ppcVar15[(ulong)(uint)argc - 1];
              pcVar9 = "output file %s not writeable\n";
            }
            else {
              iVar6 = strcmp("--zero-all-waveforms",ppcVar15[1]);
              if (iVar6 == 0) {
                local_50 = _stderr;
                local_48 = *ppcVar15;
                local_38 = ctx;
                local_40 = pFVar7;
                for (uVar14 = 0; uVar14 < (local_38->module).num_instruments; uVar14 = uVar14 + 1) {
                  pxVar12 = (local_38->module).instruments + uVar14;
                  lVar11 = 0;
                  for (uVar16 = 0; uVar16 < pxVar12->num_samples; uVar16 = uVar16 + 1) {
                    pxVar4 = pxVar12->samples;
                    memset(*(void **)((long)&pxVar4->field_11 + lVar11),0,
                           (ulong)(uint)(*(int *)((long)&pxVar4->length + lVar11) <<
                                        ((&pxVar4->bits)[lVar11] != '\b')));
                    lVar11 = lVar11 + 0x38;
                  }
                }
                fprintf(local_50,"%s: zeroing waveforms, saved %lu bytes.\n",local_48);
                ppcVar15 = local_58;
                pFVar7 = local_40;
              }
              lVar11 = 8;
              for (uVar14 = 0; uVar14 < (ctx->module).num_patterns; uVar14 = uVar14 + 1) {
                plVar1 = (long *)((long)&((ctx->module).patterns)->num_rows + lVar11);
                *plVar1 = *plVar1 - (long)ctx;
                lVar11 = lVar11 + 0x10;
              }
              for (uVar14 = 0; uVar14 < (ctx->module).num_instruments; uVar14 = uVar14 + 1) {
                uVar16 = 0;
                while( true ) {
                  pxVar12 = (ctx->module).instruments;
                  pxVar4 = pxVar12[uVar14].samples;
                  if (pxVar12[uVar14].num_samples <= uVar16) break;
                  if (1 < pxVar4[uVar16].length) {
                    uVar13 = (ulong)(pxVar4[uVar16].length - 1);
                    if (pxVar4[uVar16].bits == '\b') {
                      while( true ) {
                        pxVar12 = (ctx->module).instruments;
                        if (uVar13 == 0) break;
                        piVar5 = pxVar12[uVar14].samples[uVar16].field_11.data8;
                        pcVar8 = piVar5 + uVar13;
                        *pcVar8 = *pcVar8 - piVar5[uVar13 - 1];
                        uVar13 = uVar13 - 1;
                      }
                    }
                    else {
                      while (uVar13 != 0) {
                        psVar2 = (short *)(pxVar4[uVar16].field_11.data8 + uVar13 * 2);
                        *psVar2 = *psVar2 - *(short *)(pxVar4[uVar16].field_11.data8 +
                                                      (uVar13 - 1) * 2);
                        uVar13 = uVar13 - 1;
                      }
                    }
                  }
                  paVar3 = &pxVar12[uVar14].samples[uVar16].field_11;
                  paVar3->data8 = paVar3->data8 + -(long)ctx;
                  uVar16 = uVar16 + 1;
                }
                pxVar12[uVar14].samples = (xm_sample_t *)((long)pxVar4 - (long)ctx);
              }
              auVar17._8_4_ = (int)ctx;
              auVar17._0_8_ = ctx;
              auVar17._12_4_ = (int)((ulong)ctx >> 0x20);
              (ctx->module).patterns = (xm_pattern_t *)((long)(ctx->module).patterns - (long)ctx);
              (ctx->module).instruments =
                   (xm_instrument_t *)((long)(ctx->module).instruments - auVar17._8_8_);
              ctx->row_loop_count = ctx->row_loop_count + -(long)ctx;
              ctx->channels = (xm_channel_context_t *)((long)ctx->channels - (long)ctx);
              sVar10 = fwrite(ctx,ctx->ctx_size,1,pFVar7);
              if (sVar10 != 0) {
                fclose(pFVar7);
                fprintf(_stderr,"%s: done writing %lu bytes.\n",*ppcVar15,ctx->ctx_size);
                xm_free_context(ctx);
                return 0;
              }
              pcVar8 = (char *)ctx->ctx_size;
              pcVar9 = "fwrite() failed writing %lu bytes\n";
            }
          }
        }
      }
      else {
        pcVar8 = local_58[(ulong)(uint)argc - 2];
        pcVar9 = "input file %s not seekable\n";
      }
    }
  }
  fprintf(_stderr,pcVar9,pcVar8);
LAB_00102627:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	FILE* in;
	FILE* out;
	void* xmdata;
	size_t i, j;

	if(argc < 3) FATAL("Usage: %s [--zero-all-waveforms] <in.xm> <out.libxm>\n", argv[0]);

	fprintf(stderr, "%s: this format is highly non-portable. Check the README for more information.\n", argv[0]);

	in = fopen(argv[argc - 2], "rb");
	if(in == NULL) FATAL("input file %s not readable (fopen)\n", argv[argc - 2]);
	if(fseek(in, 0, SEEK_END)) FATAL("input file %s not seekable\n", argv[argc - 2]);
	xmdata = malloc(i = ftell(in));
	if(xmdata == NULL) FATAL("malloc failed to allocate %lu bytes\n", i);
	rewind(in);
	if(!fread(xmdata, i, 1, in)) FATAL("input file %s not readable (fread)\n", argv[argc - 2]);
	xm_create_context_safe(&ctx, xmdata, i, 48000);
	if(ctx == NULL) exit(1);
	free(xmdata);

	out = fopen(argv[argc - 1], "wb");
	if(out == NULL) FATAL("output file %s not writeable\n", argv[argc - 1]);

	if(!strcmp("--zero-all-waveforms", argv[1])) {
		fprintf(stderr, "%s: zeroing waveforms, saved %lu bytes.\n", argv[0], zero_waveforms(ctx));
	}

	/* Ugly pointer offsetting ahead */

	for(i = 0; i < ctx->module.num_patterns; ++i) {
		OFFSET(ctx->module.patterns[i].slots);
	}

	for(i = 0; i < ctx->module.num_instruments; ++i) {
		for(j = 0; j < ctx->module.instruments[i].num_samples; ++j) {
			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if(ctx->module.instruments[i].samples[j].length > 1) {
					/* Half-ass delta encoding of samples, this compresses
					 * much better */
					if(ctx->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data8[k] -= ctx->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = ctx->module.instruments[i].samples[j].length - 1; k > 0; --k) {
							ctx->module.instruments[i].samples[j].data16[k] -= ctx->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}

			OFFSET(ctx->module.instruments[i].samples[j].data8);
		}

		OFFSET(ctx->module.instruments[i].samples);
	}

	OFFSET(ctx->module.patterns);
	OFFSET(ctx->module.instruments);
	OFFSET(ctx->row_loop_count);
	OFFSET(ctx->channels);

	if(!fwrite(ctx, ctx->ctx_size, 1, out)) FATAL("fwrite() failed writing %lu bytes\n", ctx->ctx_size);
	fclose(out);
	fprintf(stderr, "%s: done writing %lu bytes.\n", argv[0], ctx->ctx_size);

	xm_free_context(ctx);
	return 0;
}